

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int qRegisterMetaType<QItemSelectionRange>(char *typeName)

{
  int iVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedType((QByteArray *)&local_28,typeName);
  iVar1 = qRegisterNormalizedMetaTypeImplementation<QItemSelectionRange>((QByteArray *)&local_28);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterMetaType(const char *typeName)
{
#ifdef QT_NO_QOBJECT
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = typeName;
#else
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = QMetaObject::normalizedType(typeName);
#endif
    return qRegisterNormalizedMetaType<T>(normalizedTypeName);
}